

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_ge_from_bytes_ext(secp256k1_ge *ge,uchar *data)

{
  secp256k1_ge_storage s;
  uint64_t local_48;
  uint64_t uStack_40;
  uint64_t local_38;
  uint64_t uStack_30;
  uint64_t local_28;
  uint64_t uStack_20;
  uint64_t local_18;
  
  local_18 = 0;
  do {
    if (data[local_18] != '\0') {
      local_48 = *(uint64_t *)data;
      uStack_40 = *(uint64_t *)(data + 8);
      local_38 = *(uint64_t *)(data + 0x10);
      uStack_30 = *(uint64_t *)(data + 0x18);
      local_28 = *(uint64_t *)(data + 0x20);
      uStack_20 = *(uint64_t *)(data + 0x28);
      local_18 = *(uint64_t *)(data + 0x30);
      secp256k1_ge_from_storage(ge,(secp256k1_ge_storage *)&local_48);
      return;
    }
    local_18 = local_18 + 1;
  } while (local_18 != 0x40);
  ge->infinity = 1;
  (ge->x).n[0] = 0;
  (ge->x).n[1] = 0;
  (ge->x).n[2] = 0;
  (ge->x).n[3] = 0;
  *(undefined8 *)((long)(ge->x).n + 0x1c) = 0;
  *(undefined8 *)((long)(ge->x).n + 0x24) = 0;
  (ge->x).normalized = 1;
  uStack_20 = 0x148364;
  secp256k1_fe_verify(&ge->x);
  *(undefined8 *)((long)(ge->y).n + 0x1c) = 0;
  *(undefined8 *)((long)(ge->y).n + 0x24) = 0;
  (ge->y).n[2] = 0;
  (ge->y).n[3] = 0;
  (ge->y).n[0] = 0;
  (ge->y).n[1] = 0;
  (ge->y).normalized = 1;
  uStack_20 = 0x14837f;
  secp256k1_fe_verify(&ge->y);
  secp256k1_ge_verify(ge);
  return;
}

Assistant:

static void secp256k1_ge_from_bytes_ext(secp256k1_ge *ge, const unsigned char *data) {
    static const unsigned char zeros[64] = { 0 };
    if (secp256k1_memcmp_var(data, zeros, sizeof(zeros)) == 0) {
        secp256k1_ge_set_infinity(ge);
    } else {
        secp256k1_ge_from_bytes(ge, data);
    }
}